

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_encoder.cc
# Opt level: O1

char * __thiscall draco::PlyEncoder::GetAttributeDataType(PlyEncoder *this,int attribute)

{
  int iVar1;
  
  iVar1 = *(int *)((long)(this->in_point_cloud_->attributes_).
                         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[attribute]._M_t.
                         super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                         ._M_t + 0x1c);
  if (iVar1 == 9) {
    return "float";
  }
  if (iVar1 != 5) {
    if (iVar1 == 2) {
      return "uchar";
    }
    return (char *)0x0;
  }
  return "int";
}

Assistant:

const char *PlyEncoder::GetAttributeDataType(int attribute) {
  // TODO(ostava): Add support for more types.
  switch (in_point_cloud_->attribute(attribute)->data_type()) {
    case DT_FLOAT32:
      return "float";
    case DT_UINT8:
      return "uchar";
    case DT_INT32:
      return "int";
    default:
      break;
  }
  return nullptr;
}